

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O2

void Tim_ManCreateBox(Tim_Man_t *p,int firstIn,int nIns,int firstOut,int nOuts,int iDelayTable,
                     int fBlack)

{
  Tim_Obj_t *pTVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  char *__assertion;
  uint uVar10;
  
  uVar7 = (ulong)(uint)nOuts;
  if (p->vBoxes == (Vec_Ptr_t *)0x0) {
    pVVar2 = (Vec_Ptr_t *)malloc(0x10);
    pVVar2->nCap = 100;
    pVVar2->nSize = 0;
    ppvVar3 = (void **)malloc(800);
    pVVar2->pArray = ppvVar3;
    p->vBoxes = pVVar2;
  }
  piVar4 = (int *)Mem_FlexEntryFetch(p->pMemObj,(nOuts + nIns) * 4 + 0x1c);
  piVar4[0] = 0;
  piVar4[1] = 0;
  piVar4[2] = 0;
  piVar4[3] = 0;
  piVar4[3] = 0;
  piVar4[4] = 0;
  piVar4[5] = 0;
  piVar4[6] = 0;
  pVVar2 = p->vBoxes;
  iVar8 = pVVar2->nSize;
  *piVar4 = iVar8;
  if (iVar8 == pVVar2->nCap) {
    uVar10 = 0x10;
    if (0xf < iVar8) {
      uVar10 = iVar8 * 2;
    }
    if (iVar8 < (int)uVar10) {
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar10 << 3);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar10 << 3);
        iVar8 = pVVar2->nSize;
      }
      pVVar2->pArray = ppvVar3;
      pVVar2->nCap = uVar10;
    }
  }
  pVVar2->nSize = iVar8 + 1;
  pVVar2->pArray[iVar8] = piVar4;
  piVar4[4] = iDelayTable;
  piVar4[2] = nIns;
  piVar4[3] = nOuts;
  piVar4[6] = fBlack;
  uVar6 = 0;
  uVar5 = 0;
  if (0 < nIns) {
    uVar5 = (ulong)(uint)nIns;
  }
  lVar9 = (long)firstIn * 0x18;
  do {
    if (uVar5 == uVar6) {
      uVar5 = 0;
      if (nOuts < 1) {
        uVar7 = 0;
      }
      lVar9 = (long)firstOut * 0x18;
      while( true ) {
        if (uVar7 == uVar5) {
          return;
        }
        if ((long)p->nCis <= (long)((long)firstOut + uVar5)) break;
        piVar4[(long)nIns + uVar5 + 7] = firstOut + (int)uVar5;
        pTVar1 = p->pCis;
        *(int *)((long)&pTVar1->iObj2Box + lVar9) = *piVar4;
        *(int *)((long)&pTVar1->iObj2Num + lVar9) = (int)uVar5;
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + 0x18;
      }
      __assertion = "firstOut+i < p->nCis";
      uVar10 = 0x43;
LAB_00389e80:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timBox.c"
                    ,uVar10,"void Tim_ManCreateBox(Tim_Man_t *, int, int, int, int, int, int)");
    }
    if ((long)p->nCos <= (long)((long)firstIn + uVar6)) {
      __assertion = "firstIn+i < p->nCos";
      uVar10 = 0x3c;
      goto LAB_00389e80;
    }
    piVar4[uVar6 + 7] = firstIn + (int)uVar6;
    pTVar1 = p->pCos;
    *(int *)((long)&pTVar1->iObj2Box + lVar9) = *piVar4;
    *(int *)((long)&pTVar1->iObj2Num + lVar9) = (int)uVar6;
    uVar6 = uVar6 + 1;
    lVar9 = lVar9 + 0x18;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates the new timing box.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Tim_ManCreateBox( Tim_Man_t * p, int firstIn, int nIns, int firstOut, int nOuts, int iDelayTable, int fBlack )
{
    Tim_Box_t * pBox;
    int i;
    if ( p->vBoxes == NULL )
        p->vBoxes = Vec_PtrAlloc( 100 );
    pBox = (Tim_Box_t *)Mem_FlexEntryFetch( p->pMemObj, sizeof(Tim_Box_t) + sizeof(int) * (nIns+nOuts) );
    memset( pBox, 0, sizeof(Tim_Box_t) );
    pBox->iBox = Vec_PtrSize( p->vBoxes );
    Vec_PtrPush( p->vBoxes, pBox );
    pBox->iDelayTable = iDelayTable;
    pBox->nInputs  = nIns;
    pBox->nOutputs = nOuts;
    pBox->fBlack = fBlack;
    for ( i = 0; i < nIns; i++ )
    {
        assert( firstIn+i < p->nCos );
        pBox->Inouts[i] = firstIn+i;
        p->pCos[firstIn+i].iObj2Box = pBox->iBox;
        p->pCos[firstIn+i].iObj2Num = i;
    }
    for ( i = 0; i < nOuts; i++ )
    {
        assert( firstOut+i < p->nCis );
        pBox->Inouts[nIns+i] = firstOut+i;
        p->pCis[firstOut+i].iObj2Box = pBox->iBox;
        p->pCis[firstOut+i].iObj2Num = i;
    }
//    if ( pBox->iBox < 20 )
//        printf( "%4d  %4d  %4d  %4d  \n", firstIn, nIns, firstOut, nOuts );
}